

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_RepeatedAndSingular_Test::
~CollectFieldsTest_RepeatedAndSingular_Test(CollectFieldsTest_RepeatedAndSingular_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CollectFieldsTest, RepeatedAndSingular) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto fields = CreateFieldArray<TestAllTypes>(field_names);
  auto chunks = CollectFields(
      fields, {}, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return lhs->is_repeated() == rhs->is_repeated();
      });

  ASSERT_EQ(chunks.size(), 2);

  EXPECT_EQ(chunks[0].fields.size(), 1);
  EXPECT_TRUE(chunks[0].fields.front()->is_repeated());

  EXPECT_EQ(chunks[1].fields.size(), 2);
  EXPECT_FALSE(chunks[1].fields.front()->is_repeated());
}